

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

int xcb_input_input_state_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_input_state_data_t *_aux)

{
  uint uVar1;
  long in_RDX;
  char in_SIL;
  long *in_RDI;
  long in_FS_OFFSET;
  char *xcb_tmp;
  uint i;
  uint xcb_block_len;
  uint xcb_parts_idx;
  uint xcb_padding_offset;
  uint xcb_align_to;
  uint xcb_buffer_len;
  char *xcb_out;
  uint xcb_pad;
  char xcb_pad0 [3];
  iovec xcb_parts [11];
  void *local_100;
  uint local_f8;
  int local_f4;
  uint local_f0;
  int local_ec;
  uint local_e8;
  int local_e4;
  void *local_e0;
  uint local_c0;
  undefined1 local_bb [3];
  ulong local_b8 [2];
  uint *puStack_a8;
  ulong auStack_a0 [19];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0 = (void *)*in_RDI;
  local_e4 = 0;
  local_ec = 2;
  local_c0 = 0;
  memset(local_bb,0,3);
  memset(local_b8,0xaa,0xb0);
  local_f0 = 0;
  local_f4 = 0;
  if (in_SIL == '\0') {
    local_b8[1] = 1;
    puStack_a8 = &local_c0;
    auStack_a0[0] = 1;
    auStack_a0[1] = in_RDX + 2;
    local_f4 = 0x22;
    auStack_a0[2] = 0x20;
    local_f0 = 3;
  }
  local_e8 = (uint)(in_SIL == '\0');
  if (in_SIL == '\x01') {
    local_b8[(ulong)local_f0 * 2] = in_RDX + 0x22;
    local_b8[(ulong)local_f0 * 2 + 1] = 1;
    local_b8[(ulong)(local_f0 + 1) * 2] = (ulong)&local_c0;
    local_b8[(ulong)(local_f0 + 1) * 2 + 1] = 1;
    local_b8[(ulong)(local_f0 + 2) * 2] = in_RDX + 0x24;
    local_f4 = local_f4 + 0x22;
    local_b8[(ulong)(local_f0 + 2) * 2 + 1] = 0x20;
    local_f0 = local_f0 + 3;
    local_e8 = 1;
  }
  if (in_SIL == '\x02') {
    local_b8[(ulong)local_f0 * 2] = in_RDX + 0x48;
    local_b8[(ulong)local_f0 * 2 + 1] = 1;
    local_b8[(ulong)(local_f0 + 1) * 2] = in_RDX + 0x49;
    local_e4 = local_f4 + 2;
    local_b8[(ulong)(local_f0 + 1) * 2 + 1] = 1;
    local_ec = 0;
    local_b8[(ulong)(local_f0 + 2) * 2] = *(ulong *)(in_RDX + 0x50);
    local_f4 = (uint)*(byte *)(in_RDX + 0x48) * 4;
    local_b8[(ulong)(local_f0 + 2) * 2 + 1] = (ulong)*(byte *)(in_RDX + 0x48) << 2;
    local_f0 = local_f0 + 3;
    local_e8 = 4;
  }
  local_c0 = -(local_f4 + local_ec) & local_e8 - 1;
  uVar1 = local_f4 + local_c0 + local_e4;
  if (local_c0 != 0) {
    local_b8[(ulong)local_f0 * 2] = (ulong)local_bb;
    local_b8[(ulong)local_f0 * 2 + 1] = (ulong)local_c0;
    local_f0 = local_f0 + 1;
    local_c0 = 0;
  }
  if (local_e0 == (void *)0x0) {
    local_e0 = malloc((ulong)uVar1);
    *in_RDI = (long)local_e0;
  }
  local_100 = local_e0;
  for (local_f8 = 0; local_f8 < local_f0; local_f8 = local_f8 + 1) {
    if ((local_b8[(ulong)local_f8 * 2] != 0) && (local_b8[(ulong)local_f8 * 2 + 1] != 0)) {
      memcpy(local_100,(void *)local_b8[(ulong)local_f8 * 2],local_b8[(ulong)local_f8 * 2 + 1]);
    }
    if (local_b8[(ulong)local_f8 * 2 + 1] != 0) {
      local_100 = (void *)(local_b8[(ulong)local_f8 * 2 + 1] + (long)local_100);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

int
xcb_input_input_state_data_serialize (void                               **_buffer,
                                      uint8_t                              class_id,
                                      const xcb_input_input_state_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 2;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[11];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_INPUT_CLASS_KEY) {
        /* xcb_input_input_state_data_t.key.num_keys */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->key.num_keys;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.keys */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->key.keys;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_BUTTON) {
        /* xcb_input_input_state_data_t.button.num_buttons */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->button.num_buttons;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.buttons */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->button.buttons;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_VALUATOR) {
        /* xcb_input_input_state_data_t.valuator.num_valuators */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->valuator.num_valuators;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.valuator.mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->valuator.mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* valuators */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->valuator.valuators;
        xcb_block_len += _aux->valuator.num_valuators * sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->valuator.num_valuators * sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}